

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int div_ab(em8051 *aCPU)

{
  byte bVar1;
  uchar *puVar2;
  byte bVar3;
  byte bVar4;
  
  puVar2 = aCPU->mSFR;
  bVar3 = puVar2[0x60];
  bVar1 = puVar2[0x70];
  puVar2[0x50] = puVar2[0x50] & 0x7b;
  if (bVar1 == 0) {
    aCPU->mSFR[0x50] = aCPU->mSFR[0x50] | 4;
    bVar4 = 0;
  }
  else {
    bVar4 = bVar3 % bVar1;
    bVar3 = bVar3 / bVar1;
  }
  aCPU->mSFR[0x60] = bVar3;
  aCPU->mSFR[0x70] = bVar4;
  aCPU->mPC = aCPU->mPC + 1;
  return 3;
}

Assistant:

static int div_ab(struct em8051 *aCPU)
{
    int a = ACC;
    int b = aCPU->mSFR[REG_B];
    int res;
    PSW &= ~(PSWMASK_C|PSWMASK_OV);
    if (b)
    {
        res = a/b;
        b = a % b;
        a = res;
    }
    else
    {
        PSW |= PSWMASK_OV;
    }
    ACC = a;
    aCPU->mSFR[REG_B] = b;
    PC++;
    return 3;
}